

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_labeled_statement_tree(FILE *out,AST_Labeled_Statement *lab)

{
  token *ptVar1;
  ulong uVar2;
  
  if (lab->type != ST_LABEL) {
    print_ast_enum(out,lab->type);
  }
  ptVar1 = lab->label;
  if ((ptVar1 != (token *)0x0) && (ptVar1->data_size != 0)) {
    uVar2 = 0;
    do {
      fputc((int)ptVar1->data[uVar2],(FILE *)out);
      uVar2 = uVar2 + 1;
    } while (uVar2 < ptVar1->data_size);
  }
  fwrite(":\n",2,1,(FILE *)out);
  print_ast(out,lab->statement);
  return;
}

Assistant:

void print_labeled_statement_tree(FILE *out,struct AST_Labeled_Statement *lab)
{
	if(lab->type!=ST_LABEL)
		print_ast_enum(out,lab->type);
	if(lab->label!=NULL)
		print_token(out,lab->label);
	fprintf(out,":\n");
	print_ast(out,lab->statement);
}